

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall Console::Prompt::Private::promptMoveEnd(Private *this)

{
  ulong uVar1;
  ulong uVar2;
  long x;
  
  uVar1 = this->caretPos;
  uVar2 = (long)(this->input)._end.item - (long)(this->input)._begin.item >> 2;
  x = uVar2 - uVar1;
  if (uVar1 <= uVar2 && x != 0) {
    moveCursorPosition(this,((long)(this->prompt)._end.item - (long)(this->prompt)._begin.item >> 2)
                            + uVar1,x);
    this->caretPos = (long)(this->input)._end.item - (long)(this->input)._begin.item >> 2;
  }
  return;
}

Assistant:

usize size() const {return _end.item - _begin.item;}